

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_set_defaults(j_compress_ptr cinfo)

{
  jpeg_component_info *pjVar1;
  int local_14;
  int i;
  j_compress_ptr cinfo_local;
  
  if (cinfo->global_state != 100) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->comp_info == (jpeg_component_info *)0x0) {
    pjVar1 = (jpeg_component_info *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x3c0);
    cinfo->comp_info = pjVar1;
  }
  cinfo->scale_num = 1;
  cinfo->scale_denom = 1;
  cinfo->data_precision = 8;
  jpeg_set_quality(cinfo,0x4b,1);
  std_huff_tables(cinfo);
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    cinfo->arith_dc_L[local_14] = '\0';
    cinfo->arith_dc_U[local_14] = '\x01';
    cinfo->arith_ac_K[local_14] = '\x05';
  }
  cinfo->scan_info = (jpeg_scan_info *)0x0;
  cinfo->num_scans = 0;
  cinfo->raw_data_in = 0;
  cinfo->arith_code = 0;
  cinfo->optimize_coding = 0;
  if (8 < cinfo->data_precision) {
    cinfo->optimize_coding = 1;
  }
  cinfo->CCIR601_sampling = 0;
  cinfo->do_fancy_downsampling = 1;
  cinfo->smoothing_factor = 0;
  cinfo->dct_method = JDCT_ISLOW;
  cinfo->restart_interval = 0;
  cinfo->restart_in_rows = 0;
  cinfo->JFIF_major_version = '\x01';
  cinfo->JFIF_minor_version = '\x01';
  cinfo->density_unit = '\0';
  cinfo->X_density = 1;
  cinfo->Y_density = 1;
  jpeg_default_colorspace(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_defaults (j_compress_ptr cinfo)
{
  int i;

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Allocate comp_info array large enough for maximum component count.
   * Array is made permanent in case application wants to compress
   * multiple images at same param settings.
   */
  if (cinfo->comp_info == NULL)
    cinfo->comp_info = (jpeg_component_info *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
				  MAX_COMPONENTS * SIZEOF(jpeg_component_info));

  /* Initialize everything not dependent on the color space */

  cinfo->scale_num = 1;		/* 1:1 scaling */
  cinfo->scale_denom = 1;
  cinfo->data_precision = BITS_IN_JSAMPLE;
  /* Set up two quantization tables using default quality of 75 */
  jpeg_set_quality(cinfo, 75, TRUE);
  /* Set up two Huffman tables */
  std_huff_tables(cinfo);

  /* Initialize default arithmetic coding conditioning */
  for (i = 0; i < NUM_ARITH_TBLS; i++) {
    cinfo->arith_dc_L[i] = 0;
    cinfo->arith_dc_U[i] = 1;
    cinfo->arith_ac_K[i] = 5;
  }

  /* Default is no multiple-scan output */
  cinfo->scan_info = NULL;
  cinfo->num_scans = 0;

  /* Expect normal source image, not raw downsampled data */
  cinfo->raw_data_in = FALSE;

  /* Use Huffman coding, not arithmetic coding, by default */
  cinfo->arith_code = FALSE;

  /* By default, don't do extra passes to optimize entropy coding */
  cinfo->optimize_coding = FALSE;
  /* The standard Huffman tables are only valid for 8-bit data precision.
   * If the precision is higher, force optimization on so that usable
   * tables will be computed.  This test can be removed if default tables
   * are supplied that are valid for the desired precision.
   */
  if (cinfo->data_precision > 8)
    cinfo->optimize_coding = TRUE;

  /* By default, use the simpler non-cosited sampling alignment */
  cinfo->CCIR601_sampling = FALSE;

  /* By default, apply fancy downsampling */
  cinfo->do_fancy_downsampling = TRUE;

  /* No input smoothing */
  cinfo->smoothing_factor = 0;

  /* DCT algorithm preference */
  cinfo->dct_method = JDCT_DEFAULT;

  /* No restart markers */
  cinfo->restart_interval = 0;
  cinfo->restart_in_rows = 0;

  /* Fill in default JFIF marker parameters.  Note that whether the marker
   * will actually be written is determined by jpeg_set_colorspace.
   *
   * By default, the library emits JFIF version code 1.01.
   * An application that wants to emit JFIF 1.02 extension markers should set
   * JFIF_minor_version to 2.  We could probably get away with just defaulting
   * to 1.02, but there may still be some decoders in use that will complain
   * about that; saying 1.01 should minimize compatibility problems.
   */
  cinfo->JFIF_major_version = 1; /* Default JFIF version = 1.01 */
  cinfo->JFIF_minor_version = 1;
  cinfo->density_unit = 0;	/* Pixel size is unknown by default */
  cinfo->X_density = 1;		/* Pixel aspect ratio is square by default */
  cinfo->Y_density = 1;

  /* Choose JPEG colorspace based on input space, set defaults accordingly */

  jpeg_default_colorspace(cinfo);
}